

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O3

error<idx2::idx2_err_code>
idx2::TraverseSecondLevel
          (idx2_file *Idx2,params *P,decode_data *D,decode_state First,extent *Extent,grid *OutGrid,
          mmap_volume *OutVolFile,volume *OutVolMem)

{
  i64 *piVar1;
  byte *pbVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  byte bVar5;
  byte bVar6;
  undefined2 uVar7;
  _func_int **pp_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  decode_state Ds;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  byte bVar20;
  decode_data *pdVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  long lVar24;
  undefined1 uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  _func_int **pp_Var31;
  u64 uVar32;
  ulong uVar33;
  uint uVar34;
  i64 iVar35;
  undefined8 uVar36;
  int *piVar37;
  ulong *puVar38;
  uint uVar39;
  int iVar40;
  int *piVar41;
  uint uVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  int iVar52;
  _func_int ***ppp_Var53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  byte Level;
  long *in_FS_OFFSET;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  extent eVar60;
  error<idx2::idx2_err_code> eVar61;
  v3i Brick3;
  brick_traverse First_3;
  extent Skip;
  extent Skip_1;
  extent CurrentExtent;
  chunk_traverse First_2;
  file_traverse First_1;
  file_traverse FileStack [64];
  ulong local_2f18;
  undefined8 local_2ee0;
  _func_int **local_2ed8;
  undefined4 local_2eb8;
  undefined4 uStack_2eb4;
  undefined4 uStack_2eb0;
  undefined8 uStack_2ea8;
  uint uStack_2ea0;
  int aiStack_2e9c [3];
  long lStack_2e90;
  int iStack_2e88;
  undefined4 uStack_2e84;
  long lStack_2e80;
  array<idx2::decode_state> local_2e78;
  params *local_2e40;
  decode_data *local_2e38;
  undefined8 local_2e30;
  extent local_2e28;
  extent local_2e18;
  extent local_2e08;
  undefined8 uStack_2df8;
  int iStack_2df0;
  int iStack_2dec;
  int iStack_2de8;
  int iStack_2de4;
  long lStack_2de0;
  int iStack_2dd8;
  undefined4 uStack_2dd4;
  long lStack_2dd0;
  extent local_2dc8;
  stack_array<idx2::v3<int>,_16> *local_2db0;
  stack_array<idx2::v3<int>,_16> *local_2da8;
  stack_array<idx2::v3<int>,_16> *local_2da0;
  f64 local_2d98;
  grid *local_2d90;
  mmap_volume *local_2d88;
  extent *local_2d80;
  undefined8 local_2d78;
  undefined8 local_2d70;
  extent local_2d68;
  extent local_2d58;
  extent local_2d48;
  extent local_2d38;
  undefined8 local_2d28;
  undefined3 uStack_2d20;
  undefined5 uStack_2d1d;
  undefined3 uStack_2d18;
  undefined8 uStack_2d15;
  undefined4 local_2d08;
  undefined4 uStack_2d04;
  undefined4 uStack_2d00;
  undefined4 uStack_2cfc;
  extent local_2cf8;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  int local_2c98;
  int iStack_2c94;
  int iStack_2c90;
  undefined8 uStack_2c8c;
  undefined8 uStack_2c84;
  byte bStack_2c7c;
  undefined2 uStack_2c7b;
  byte bStack_2c79;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 uStack_2c40;
  _func_int **local_2c38 [2];
  undefined8 uStack_2c28;
  uint uStack_2c20;
  undefined1 auStack_2c1c [8];
  int iStack_2c14;
  long lStack_2c10;
  int aiStack_2c08 [2];
  long alStack_2c00 [503];
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  expected<idx2::brick_volume,_idx2::idx2_err_code> local_1c38 [51];
  unsigned_long local_c38 [2];
  int aiStack_c28 [2];
  undefined1 auStack_c20 [8];
  int aiStack_c18 [2];
  long alStack_c10 [380];
  
  auVar57._8_8_ = 0;
  auVar57._0_8_ = P->DecodeTolerance;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = Idx2->Tolerance;
  auVar4 = vmaxsd_avx(auVar57,auVar4);
  local_2d98 = auVar4._0_8_;
  local_2e40 = P;
  local_2d90 = OutGrid;
  local_2d88 = OutVolFile;
  if (Mallocator()::Instance == '\0') {
    TraverseSecondLevel();
  }
  if (Mallocator()::Instance == '\0') {
    TraverseSecondLevel();
  }
  local_2e78.Buffer.Data = (byte *)0x0;
  local_2e78.Buffer.Bytes = 0;
  local_2e78.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_2e78.Size = 0;
  local_2e78.Capacity = 0;
  local_2e78.Alloc = (allocator *)&Mallocator()::Instance;
  GrowCapacity<idx2::decode_state>(&local_2e78,0x80);
  iVar35 = local_2e78.Size;
  if (local_2e78.Capacity <= local_2e78.Size) {
    GrowCapacity<idx2::decode_state>(&local_2e78,0);
    iVar35 = local_2e78.Size;
  }
  local_2e78.Size = iVar35 + 1;
  lVar49 = iVar35 * 0x60;
  uVar36 = First.ParentBrick._56_8_;
  *(undefined1 (*) [32])(local_2e78.Buffer.Data + lVar49 + 0x3e) = First._62_32_;
  pbVar2 = local_2e78.Buffer.Data + lVar49 + 0x20;
  pbVar2[0] = First.ParentBrick.Vol.Type;
  pbVar2[1] = First.ParentBrick.Vol._33_1_;
  pbVar2[2] = First.ParentBrick.Vol._34_1_;
  pbVar2[3] = First.ParentBrick.Vol._35_1_;
  pbVar2[4] = First.ParentBrick.Vol._36_1_;
  pbVar2[5] = First.ParentBrick.Vol._37_1_;
  pbVar2[6] = First.ParentBrick.Vol._38_1_;
  pbVar2[7] = First.ParentBrick.Vol._39_1_;
  *(u64 *)(pbVar2 + 8) = First.ParentBrick.ExtentLocal.From;
  *(u64 *)(pbVar2 + 0x10) = First.ParentBrick.ExtentLocal.Dims;
  *(undefined8 *)(pbVar2 + 0x18) = uVar36;
  pbVar2 = local_2e78.Buffer.Data + lVar49;
  *(byte **)pbVar2 = First.ParentBrick.Vol.Buffer.Data;
  *(i64 *)(pbVar2 + 8) = First.ParentBrick.Vol.Buffer.Bytes;
  *(allocator **)(pbVar2 + 0x10) = First.ParentBrick.Vol.Buffer.Alloc;
  *(u64 *)(pbVar2 + 0x18) = First.ParentBrick.Vol.Dims;
  local_2e38 = D;
  if (iVar35 < 0) {
    bVar20 = 0;
  }
  else {
    local_2d80 = &local_2e40->DecodeExtent;
    local_2da0 = &Idx2->NFiles3;
    local_2da8 = &Idx2->ChunksPerFile3s;
    local_2db0 = &Idx2->BricksPerChunk3s;
    local_2e30 = 0x100000001;
    local_2d08 = 1;
    uStack_2d04 = 1;
    uStack_2d00 = 1;
    uStack_2cfc = 1;
    bVar20 = 0;
    do {
      local_2e78.Size = local_2e78.Size + -1;
      lVar49 = local_2e78.Size * 0x60;
      pbVar2 = local_2e78.Buffer.Data + lVar49;
      local_2c78 = *(undefined8 *)pbVar2;
      uStack_2c70 = *(undefined8 *)(pbVar2 + 8);
      uStack_2c68 = *(undefined8 *)(pbVar2 + 0x10);
      uStack_2c60 = *(undefined8 *)(pbVar2 + 0x18);
      pbVar2 = local_2e78.Buffer.Data + lVar49 + 0x20;
      local_2c58 = *(undefined8 *)pbVar2;
      uStack_2c50 = *(undefined8 *)(pbVar2 + 8);
      uStack_2c48 = *(undefined8 *)(pbVar2 + 0x10);
      uStack_2c40 = *(undefined8 *)(pbVar2 + 0x18);
      iVar44 = *(int *)(local_2e78.Buffer.Data + lVar49 + 0x40);
      iVar28 = *(int *)(local_2e78.Buffer.Data + lVar49 + 0x44);
      iVar52 = *(int *)(local_2e78.Buffer.Data + lVar49 + 0x48);
      local_2ce8 = *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x4c);
      uStack_2ce0 = *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x4c + 8);
      bVar5 = local_2e78.Buffer.Data[lVar49 + 0x5c];
      iVar46 = (int)(char)bVar5;
      uVar7 = *(undefined2 *)(local_2e78.Buffer.Data + lVar49 + 0x5d);
      bVar6 = local_2e78.Buffer.Data[lVar49 + 0x5f];
      iVar26 = 1;
      uVar36 = local_2e30;
      if ('\0' < (char)bVar5) {
        iVar26 = 1;
        do {
          iVar26 = iVar26 * (Idx2->GroupBrick3).field_0.field_0.Z;
          uVar36 = CONCAT44((int)((ulong)uVar36 >> 0x20) * (Idx2->GroupBrick3).field_0.field_0.Y,
                            (Idx2->GroupBrick3).field_0.field_0.X * (int)uVar36);
          iVar46 = iVar46 + -1;
        } while (iVar46 != 0);
      }
      uVar39 = (Idx2->BrickDims3).field_0.field_0.X * (int)uVar36;
      uVar34 = (int)((ulong)uVar36 >> 0x20) * (Idx2->BrickDims3).field_0.field_0.Y;
      uVar27 = iVar26 * (Idx2->BrickDims3).field_0.field_0.Z;
      local_2e18.From = 0;
      local_2e18.Dims = 0;
      local_2e28.From = 0;
      local_2e28.Dims = 0;
      local_2dc8.From = 0;
      local_2dc8.Dims = 0;
      local_2d38.From = 0;
      local_2d38.Dims = 0;
      local_2d48.From = 0;
      local_2d48.Dims = 0;
      local_2cf8.From = 0;
      local_2cf8.Dims = 0;
      local_2d58.From =
           (ulong)(uVar27 * iVar52 & 0x1fffff) << 0x2a |
           (ulong)(uVar34 * iVar28 & 0x1fffff) << 0x15 | (ulong)(uVar39 * iVar44 & 0x1fffff);
      local_2d58.Dims =
           (ulong)(uVar27 & 0x1fffff) << 0x2a |
           (ulong)(uVar34 & 0x1fffff) << 0x15 | (ulong)(uVar39 & 0x1fffff);
      eVar60 = Crop<idx2::extent,idx2::extent>(&local_2d58,local_2d80);
      if ((long)(eVar60.Dims * 2) >> 0x2b != 0 &&
          ((long)(eVar60.Dims << 0x16) >> 0x2b != 0 &&
          ((undefined1  [16])eVar60 & (undefined1  [16])0x1fffff) != (undefined1  [16])0x0)) {
        local_2cd8 = local_2c78;
        uStack_2cd0 = uStack_2c70;
        uStack_2cc8 = uStack_2c68;
        uStack_2cc0 = uStack_2c60;
        local_2cb8 = local_2c58;
        uStack_2cb0 = uStack_2c50;
        uStack_2ca8 = uStack_2c48;
        uStack_2ca0 = uStack_2c40;
        uStack_2c8c = local_2ce8;
        uStack_2c84 = uStack_2ce0;
        Ds.Brick3.field_0.field_0.Y = iVar28;
        Ds.Brick3.field_0.field_0.X = iVar44;
        Ds.Brick3.field_0.field_0.Z = iVar52;
        Ds._76_8_ = local_2ce8;
        Ds._84_8_ = uStack_2ce0;
        Ds.Level = bVar5;
        Ds._93_2_ = uVar7;
        Ds._95_1_ = bVar6;
        Ds.ParentBrick.Vol.Buffer.Bytes = uStack_2c70;
        Ds.ParentBrick.Vol.Buffer.Data = (byte *)local_2c78;
        Ds.ParentBrick.Vol.Buffer.Alloc = (allocator *)uStack_2c68;
        Ds.ParentBrick.Vol.Dims = uStack_2c60;
        Ds.ParentBrick.Vol._32_8_ = local_2c58;
        Ds.ParentBrick.ExtentLocal.From = uStack_2c50;
        Ds.ParentBrick.ExtentLocal.Dims = uStack_2c48;
        Ds.ParentBrick.NChildrenDecoded = (undefined1)uStack_2c40;
        Ds.ParentBrick.NChildrenMax = uStack_2c40._1_1_;
        Ds.ParentBrick.Significant = (bool)uStack_2c40._2_1_;
        Ds.ParentBrick.DoneDecoding = (bool)uStack_2c40._3_1_;
        Ds.ParentBrick._60_4_ = uStack_2c40._4_4_;
        local_2c98 = iVar44;
        iStack_2c94 = iVar28;
        iStack_2c90 = iVar52;
        bStack_2c7c = bVar5;
        uStack_2c7b = uVar7;
        bStack_2c79 = bVar6;
        DecodeTask(local_1c38,Idx2,local_2e40,local_2e38,Ds,*local_2d90,local_2d98,local_2d88,
                   OutVolMem);
        bVar20 = local_1c38[0].Ok;
        uVar25 = local_1c38[0].field_1.Val.Vol.Type;
        uVar36 = local_1c38[0].field_1.Val.Vol.Buffer.Data;
        local_2ed8 = (_func_int **)local_1c38[0].field_1._0_8_;
        local_2ee0 = CONCAT44(local_1c38[0].field_1.Val.Vol.Buffer.Bytes._4_4_,
                              (undefined4)local_1c38[0].field_1.Val.Vol.Buffer.Bytes);
        local_2d70 = CONCAT44(local_1c38[0].field_1._20_4_,local_1c38[0].field_1._16_4_);
        local_2d78 = CONCAT44(local_1c38[0].field_1.Val.Vol.Dims._4_4_,
                              (undefined4)local_1c38[0].field_1.Val.Vol.Dims);
        local_2d28 = CONCAT17((undefined1)local_1c38[0].field_1.Val.ExtentLocal.From,
                              local_1c38[0].field_1._33_7_);
        uStack_2d1d = CONCAT14((undefined1)local_1c38[0].field_1.Val.ExtentLocal.Dims,
                               local_1c38[0].field_1.Val.ExtentLocal.From._4_4_);
        auVar19._5_7_ = local_1c38[0].field_1.Val.ExtentLocal.Dims._1_7_;
        auVar19._0_5_ = uStack_2d1d;
        auVar19._12_4_ = local_1c38[0].field_1._56_4_;
        uStack_2d20 = local_1c38[0].field_1.Val.ExtentLocal.From._1_3_;
        uStack_2d18 = (undefined3)local_1c38[0].field_1.Val.ExtentLocal.Dims._1_7_;
        uStack_2d15 = auVar19._8_8_;
        if ((local_1c38[0].Ok & 1U) == 0) break;
        Level = bVar5 - 1;
        uVar27 = (uint)Level;
        if (-1 < (char)Level) {
          if (0xf < Level) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]"
                         );
          }
          if ((Idx2->DecodeSubbandMasks).Arr[uVar27] != '\0') {
            ComputeExtentsForTraversal
                      (Idx2,&local_2d58,Level,&local_2e18,&local_2e28,&local_2dc8,&local_2d38,
                       &local_2d48,&local_2cf8);
            lVar49 = 0x28;
            do {
              *(undefined8 *)((long)local_c38 + lVar49) = 0;
              lVar49 = lVar49 + 0x30;
            } while (lVar49 != 0xc28);
            lVar49 = (long)local_2da0->Arr[uVar27].field_0.field_0.X;
            if (lVar49 == 0) {
              uVar30 = 1;
            }
            else {
              uVar29 = lVar49 - 1;
              lVar49 = 0x3f;
              if (uVar29 != 0) {
                for (; uVar29 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                }
              }
              uVar30 = 1L << (-((byte)lVar49 ^ 0x3f) & 0x3f) & 0xffffffff;
              if (uVar29 == 0) {
                uVar30 = 1;
              }
            }
            lVar49 = (long)local_2da0->Arr[uVar27].field_0.field_0.Y;
            uVar29 = 0x100000000;
            if (lVar49 != 0) {
              uVar50 = lVar49 - 1;
              lVar49 = 0x3f;
              if (uVar50 != 0) {
                for (; uVar50 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                }
              }
              uVar29 = 0x100000000 << (-((byte)lVar49 ^ 0x3f) & 0x3f);
              if (uVar50 == 0) {
                uVar29 = 0x100000000;
              }
            }
            lVar49 = (long)local_2da0->Arr[uVar27].field_0.field_0.Z;
            if (lVar49 == 0) {
              aiStack_c18[1] = 1;
            }
            else {
              uVar50 = lVar49 - 1;
              lVar49 = 0x3f;
              if (uVar50 != 0) {
                for (; uVar50 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                }
              }
              aiStack_c18[1] = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
              if (uVar50 == 0) {
                aiStack_c18[1] = 1;
              }
            }
            local_c38[0] = (Idx2->FilesOrder).Arr[uVar27];
            local_c38[1] = local_c38[0];
            aiStack_c28[0] = 0;
            aiStack_c28[1] = 0;
            auStack_c20._0_4_ = 0;
            stack0xfffffffffffff3e4 = uVar29 | uVar30;
            alStack_c10[0] = 0;
            lVar49 = (ulong)(uVar27 * 4) * 3;
            piVar37 = (int *)((long)&local_2da8->Arr[0].field_0 + lVar49);
            piVar41 = (int *)((long)&local_2db0->Arr[0].field_0 + lVar49);
            uVar30 = 0;
            do {
              lVar49 = uVar30 * 0x30;
              puVar38 = local_c38 + uVar30 * 6;
              uVar29 = *puVar38;
              uVar50 = uVar29 >> 2;
              *puVar38 = uVar50;
              uVar34 = (uint)uVar29 & 3;
              local_2f18 = uVar30;
              if (uVar34 == 3) {
                if (uVar50 == 3) {
                  *puVar38 = local_c38[uVar30 * 6 + 1];
                }
                else {
                  local_c38[uVar30 * 6 + 1] = uVar50;
                }
              }
              else {
                local_2f18 = (ulong)((int)uVar30 - 1);
                iVar44 = aiStack_c28[uVar30 * 0xc];
                if (((*(int *)(auStack_c20 + lVar49 + 4) - iVar44 == 1) &&
                    (iVar28 = aiStack_c28[uVar30 * 0xc + 1], aiStack_c18[uVar30 * 0xc] - iVar28 == 1
                    )) && (iVar52 = *(int *)(auStack_c20 + uVar30 * 0x30),
                          *(int *)((long)alStack_c10 + lVar49 + -4) - iVar52 == 1)) {
                  lVar49 = 0x38;
                  do {
                    *(undefined8 *)((long)&uStack_1c48 + lVar49) = 0;
                    *(undefined4 *)((long)auStack_1c40 + lVar49) = 0;
                    *(undefined8 *)((long)&local_1c38[0]._vptr_expected + lVar49) = 0;
                    lVar49 = lVar49 + 0x40;
                  } while (lVar49 != 0x1038);
                  iVar26 = *piVar37;
                  iVar46 = 1;
                  iVar47 = 1;
                  if ((long)iVar26 != 0) {
                    uVar30 = (long)iVar26 - 1;
                    lVar49 = 0x3f;
                    if (uVar30 != 0) {
                      for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                      }
                    }
                    iVar47 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                    if (uVar30 == 0) {
                      iVar47 = 1;
                    }
                  }
                  iVar40 = piVar37[1];
                  if ((long)iVar40 != 0) {
                    uVar30 = (long)iVar40 - 1;
                    lVar49 = 0x3f;
                    if (uVar30 != 0) {
                      for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                      }
                    }
                    iVar46 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                    if (uVar30 == 0) {
                      iVar46 = 1;
                    }
                  }
                  iVar45 = piVar37[2];
                  if ((long)iVar45 == 0) {
                    iVar48 = 1;
                  }
                  else {
                    uVar30 = (long)iVar45 - 1;
                    lVar49 = 0x3f;
                    if (uVar30 != 0) {
                      for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                      }
                    }
                    iVar48 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                    if (uVar30 == 0) {
                      iVar48 = 1;
                    }
                  }
                  local_1c38[0]._vptr_expected = (_func_int **)(Idx2->ChunksOrderInFile).Arr[uVar27]
                  ;
                  local_1c38[0].field_1._8_4_ = iVar26 * iVar44;
                  local_1c38[0].field_1._12_4_ = iVar40 * iVar28;
                  local_1c38[0].field_1._16_4_ = iVar45 * iVar52;
                  local_1c38[0].field_1.Val.Vol.Buffer.Data = local_1c38[0]._vptr_expected;
                  local_1c38[0].field_1._20_4_ = iVar47 + local_1c38[0].field_1._8_4_;
                  local_1c38[0].field_1.Val.Vol.Dims._0_4_ = iVar46 + local_1c38[0].field_1._12_4_;
                  local_1c38[0].field_1.Val.Vol.Dims._4_4_ = iVar48 + local_1c38[0].field_1._16_4_;
                  local_1c38[0].field_1.Val.Vol.Type = int8;
                  local_1c38[0].field_1._33_7_ = 0;
                  local_1c38[0].field_1.Val.ExtentLocal.From._0_4_ = 0;
                  local_1c38[0].field_1.Val.ExtentLocal.Dims._0_1_ = 0;
                  local_1c38[0].field_1.Val.ExtentLocal.Dims._1_7_ = 0;
                  uVar30 = 0;
                  do {
                    lVar49 = uVar30 * 0x40;
                    ppp_Var53 = &local_1c38[0]._vptr_expected + uVar30 * 8;
                    pp_Var8 = *ppp_Var53;
                    pp_Var31 = (_func_int **)((ulong)pp_Var8 >> 2);
                    *ppp_Var53 = pp_Var31;
                    uVar34 = (uint)pp_Var8 & 3;
                    uVar29 = uVar30;
                    if (uVar34 == 3) {
                      if (pp_Var31 == (_func_int **)0x3) {
                        *ppp_Var53 = (_func_int **)
                                     (&local_1c38[0].field_1)[uVar30].Val.Vol.Buffer.Data;
                      }
                      else {
                        (&local_1c38[0].field_1)[uVar30].Val.Vol.Buffer.Data = (byte *)pp_Var31;
                      }
                    }
                    else {
                      uVar29 = (ulong)((int)uVar30 - 1);
                      iVar44 = *(int *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 8);
                      if (((*(int *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x14) - iVar44
                            == 1) &&
                          (iVar28 = *(int *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0xc),
                          *(int *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x18) - iVar28 ==
                          1)) && (iVar52 = *(int *)((long)&local_1c38[0].field_1 +
                                                   uVar30 * 0x40 + 0x10),
                                 *(int *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x1c) -
                                 iVar52 == 1)) {
                        lVar49 = 0x38;
                        do {
                          *(undefined8 *)((long)&uStack_2c48 + lVar49) = 0;
                          *(undefined4 *)((long)&uStack_2c40 + lVar49) = 0;
                          *(undefined8 *)((long)local_2c38 + lVar49) = 0;
                          lVar49 = lVar49 + 0x40;
                        } while (lVar49 != 0x1038);
                        iVar26 = *piVar41;
                        iVar46 = 1;
                        iVar47 = 1;
                        if ((long)iVar26 != 0) {
                          uVar30 = (long)iVar26 - 1;
                          lVar49 = 0x3f;
                          if (uVar30 != 0) {
                            for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                            }
                          }
                          iVar47 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                          if (uVar30 == 0) {
                            iVar47 = 1;
                          }
                        }
                        iVar40 = piVar41[1];
                        if ((long)iVar40 != 0) {
                          uVar30 = (long)iVar40 - 1;
                          lVar49 = 0x3f;
                          if (uVar30 != 0) {
                            for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                            }
                          }
                          iVar46 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                          if (uVar30 == 0) {
                            iVar46 = 1;
                          }
                        }
                        iVar45 = piVar41[2];
                        if ((long)iVar45 == 0) {
                          iVar48 = 1;
                        }
                        else {
                          uVar30 = (long)iVar45 - 1;
                          lVar49 = 0x3f;
                          if (uVar30 != 0) {
                            for (; uVar30 >> lVar49 == 0; lVar49 = lVar49 + -1) {
                            }
                          }
                          iVar48 = (int)(1L << (-((byte)lVar49 ^ 0x3f) & 0x3f));
                          if (uVar30 == 0) {
                            iVar48 = 1;
                          }
                        }
                        local_2c38[0] = (_func_int **)(Idx2->BricksOrderInChunk).Arr[uVar27];
                        uStack_2c28._0_4_ = iVar26 * iVar44;
                        uVar50 = (ulong)(uint)uStack_2c28;
                        uStack_2c28._4_4_ = iVar40 * iVar28;
                        uStack_2c20 = iVar45 * iVar52;
                        local_2c38[1] = local_2c38[0];
                        auStack_2c1c._0_4_ = iVar47 + (uint)uStack_2c28;
                        auStack_2c1c._4_4_ = iVar46 + uStack_2c28._4_4_;
                        iStack_2c14 = iVar48 + uStack_2c20;
                        uVar30 = 0;
                        lStack_2c10 = 0;
                        aiStack_2c08[0] = 0;
                        alStack_2c00[0] = 0;
                        do {
                          ppp_Var53 = local_2c38 + uVar30 * 8;
                          pp_Var8 = *ppp_Var53;
                          pp_Var31 = (_func_int **)((ulong)pp_Var8 >> 2);
                          *ppp_Var53 = pp_Var31;
                          uVar34 = (uint)pp_Var8 & 3;
                          if (uVar34 == 3) {
                            if (pp_Var31 == (_func_int **)0x3) {
                              *ppp_Var53 = local_2c38[uVar30 * 8 + 1];
                            }
                            else {
                              local_2c38[uVar30 * 8 + 1] = pp_Var31;
                            }
                          }
                          else {
                            uVar56 = (ulong)((int)uVar30 - 1);
                            auVar58._8_8_ = 0;
                            auVar58._0_8_ = *(ulong *)(auStack_2c1c + uVar30 * 0x40);
                            auVar59._8_8_ = 0;
                            auVar59._0_8_ = (&uStack_2c28)[uVar30 * 8];
                            auVar4 = vpsubd_avx(auVar58,auVar59);
                            auVar16._4_4_ = uStack_2d04;
                            auVar16._0_4_ = local_2d08;
                            auVar16._8_4_ = uStack_2d00;
                            auVar16._12_4_ = uStack_2cfc;
                            auVar4 = vpcmpeqd_avx(auVar4,auVar16);
                            auVar4 = vpmovsxdq_avx(auVar4);
                            uVar39 = vmovmskpd_avx(auVar4);
                            if ((((uVar39 & 1) == 0) || ((byte)((byte)uVar39 >> 1) == 0)) ||
                               ((&iStack_2c14)[uVar30 * 0x10] - (&uStack_2c20)[uVar30 * 0x10] != 1))
                            {
                              pp_Var8 = *ppp_Var53;
                              pp_Var31 = local_2c38[uVar30 * 8 + 1];
                              uVar50 = (&uStack_2c28)[uVar30 * 8];
                              lStack_2e90 = (&lStack_2c10)[uVar30 * 8];
                              lStack_2e80 = alStack_2c00[uVar30 * 8];
                              aiStack_2e9c[1] =
                                   (int)*(undefined8 *)(auStack_2c1c + uVar30 * 0x40 + 4);
                              aiStack_2e9c[2] =
                                   (int)((ulong)*(undefined8 *)(auStack_2c1c + uVar30 * 0x40 + 4) >>
                                        0x20);
                              iStack_2e88 = (int)*(undefined8 *)(aiStack_2c08 + uVar30 * 0x10);
                              uStack_2e84 = (undefined4)
                                            ((ulong)*(undefined8 *)(aiStack_2c08 + uVar30 * 0x10) >>
                                            0x20);
                              local_2eb8 = SUB84(pp_Var8,0);
                              uStack_2ea0 = (uint)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10);
                              uVar39 = uStack_2ea0;
                              aiStack_2e9c[0] =
                                   (int)((ulong)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10) >>
                                        0x20);
                              local_2e08.From = (u64)*ppp_Var53;
                              local_2e08.Dims = (u64)local_2c38[uVar30 * 8 + 1];
                              uStack_2df8 = (&uStack_2c28)[uVar30 * 8];
                              auVar3 = *(undefined1 (*) [32])(&uStack_2c20 + uVar30 * 0x10);
                              iStack_2de8 = auVar3._8_4_;
                              iStack_2de4 = auVar3._12_4_;
                              lStack_2de0 = auVar3._16_8_;
                              iStack_2dd8 = auVar3._24_4_;
                              uStack_2dd4 = auVar3._28_4_;
                              iStack_2df0 = (int)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10);
                              iStack_2dec = (int)((ulong)*(undefined8 *)
                                                          (&uStack_2c20 + uVar30 * 0x10) >> 0x20);
                              uVar33 = (ulong)(uVar34 << 2);
                              iVar44 = *(int *)((long)&uStack_2c28 + uVar33 + uVar30 * 0x40);
                              iVar44 = (*(int *)(auStack_2c1c + uVar33 + uVar30 * 0x40) - iVar44) /
                                       2 + iVar44;
                              *(int *)((long)aiStack_2e9c + uVar33) = iVar44;
                              lVar49 = lStack_2e90;
                              iVar26 = aiStack_2e9c[2];
                              iVar52 = aiStack_2e9c[1];
                              iVar28 = aiStack_2e9c[0];
                              *(int *)((long)&uStack_2df8 + uVar33) = iVar44;
                              uStack_2ea8._0_4_ = (int)uVar50;
                              iVar44 = (int)uStack_2ea8;
                              uStack_2ea8._4_4_ = (uint)(uVar50 >> 0x20);
                              uVar34 = uStack_2ea8._4_4_;
                              uVar55 = aiStack_2e9c[0] - (int)uStack_2ea8;
                              uVar43 = aiStack_2e9c[1] - uStack_2ea8._4_4_;
                              uVar42 = aiStack_2e9c[2] - uStack_2ea0;
                              local_2d68.From =
                                   (ulong)(uStack_2ea0 & 0x1fffff) << 0x2a |
                                   ((ulong)uStack_2ea8._4_4_ & 0x1fffff) << 0x15 | uVar50 & 0x1fffff
                              ;
                              local_2d68.Dims =
                                   (ulong)(uVar42 & 0x1fffff) << 0x2a |
                                   (ulong)(uVar43 & 0x1fffff) << 0x15 | (ulong)(uVar55 & 0x1fffff);
                              uStack_2ea8 = uVar50;
                              eVar60 = Crop<idx2::extent,idx2::extent>(&local_2d68,&local_2e18);
                              iVar46 = iStack_2e88;
                              uVar32 = eVar60.Dims;
                              lStack_2de0 = ((long)(uVar32 << 0x16) >> 0x2b) *
                                            ((long)(uVar32 << 0x2b) >> 0x2b) *
                                            ((long)(uVar32 * 2) >> 0x2b) + lVar49;
                              eVar60 = Crop<idx2::extent,idx2::extent>(&local_2d68,&local_2d38);
                              iStack_2dd8 = (((int)eVar60.Dims << 0xb) >> 0xb) *
                                            (int)((long)(eVar60.Dims * 2) >> 0x2b) *
                                            (int)((long)(eVar60.Dims << 0x16) >> 0x2b) + iVar46;
                              lStack_2e80 = alStack_2c00[uVar30 * 8];
                              lStack_2dd0 = (long)(int)uVar42 *
                                            (long)(int)uVar43 * (long)(int)uVar55 + lStack_2e80;
                              uVar50 = ((long)(local_2e18.Dims << 0x16) >> 0xb) +
                                       ((long)(local_2e18.From << 0x16) >> 0xb & 0xffffffff00000000U
                                       );
                              iVar40 = (int)((long)(local_2e18.From << 0x2b) >> 0x2b);
                              iVar45 = (((int)local_2e18.Dims << 0xb) >> 0xb) + iVar40;
                              iVar46 = (int)((long)(local_2e18.From * 2) >> 0x2b);
                              iVar48 = (int)((long)(local_2e18.Dims * 2) >> 0x2b) + iVar46;
                              iVar51 = (int)(uVar50 >> 0x20);
                              iVar47 = (int)((long)(local_2e18.From << 0x16) >> 0x2b);
                              if ((((int)uStack_2df8 < iVar45) && (uStack_2df8._4_4_ < iVar51)) &&
                                 (((iStack_2df0 < iVar48 &&
                                   ((iVar40 < iStack_2dec && (iVar47 < iStack_2de8)))) &&
                                  (iVar46 < iStack_2de4)))) {
                                auVar15._4_4_ = iStack_2de4;
                                auVar15._0_4_ = iStack_2de8;
                                auVar15._8_8_ = lStack_2de0;
                                auVar15._16_4_ = iStack_2dd8;
                                auVar15._20_4_ = uStack_2dd4;
                                auVar15._24_8_ = lStack_2dd0;
                                *(undefined1 (*) [32])(auStack_2c1c + uVar30 * 0x40 + 4) = auVar15;
                                *ppp_Var53 = (_func_int **)local_2e08.From;
                                local_2c38[uVar30 * 8 + 1] = (_func_int **)local_2e08.Dims;
                                (&uStack_2c28)[uVar30 * 8] = uStack_2df8;
                                *(ulong *)(&uStack_2c20 + uVar30 * 0x10) =
                                     CONCAT44(iStack_2dec,iStack_2df0);
                                uVar56 = uVar30;
                              }
                              uVar30 = uVar56;
                              if ((((iVar44 < iVar45) &&
                                   (uVar50 = uVar50 >> 0x20, (int)uVar34 < iVar51)) &&
                                  ((int)uVar39 < iVar48)) &&
                                 ((iVar40 < iVar28 && (iVar46 < iVar26 && iVar47 < iVar52)))) {
                                uVar30 = (ulong)((int)uVar30 + 1);
                                auVar14._4_4_ = aiStack_2e9c[2];
                                auVar14._0_4_ = aiStack_2e9c[1];
                                auVar14._8_8_ = lStack_2e90;
                                auVar14._16_4_ = iStack_2e88;
                                auVar14._20_4_ = uStack_2e84;
                                auVar14._24_8_ = lStack_2e80;
                                *(undefined1 (*) [32])(auStack_2c1c + uVar30 * 0x40 + 4) = auVar14;
                                local_2c38[uVar30 * 8] = pp_Var8;
                                local_2c38[uVar30 * 8 + 1] = pp_Var31;
                                (&uStack_2c28)[uVar30 * 8] = uStack_2ea8;
                                *(ulong *)(&uStack_2c20 + uVar30 * 0x10) =
                                     CONCAT44(aiStack_2e9c[0],uStack_2ea0);
                              }
                            }
                            else {
                              if (Mallocator()::Instance == '\0') {
                                TraverseSecondLevel();
                              }
                              iVar44 = aiStack_2c08[uVar30 * 0x10];
                              uVar34 = (&uStack_2c20)[uVar30 * 0x10];
                              uStack_2eb4 = (undefined4)(&uStack_2c28)[uVar30 * 8];
                              uStack_2eb0 = (undefined4)((ulong)(&uStack_2c28)[uVar30 * 8] >> 0x20);
                              Brick3.field_0.field_0.Y = 0;
                              Brick3.field_0.field_0.X = (&uStack_2c20)[uVar30 * 0x10];
                              Brick3.field_0._8_4_ = (undefined4)uVar50;
                              uVar50 = uVar50 & 0xffffffff;
                              uVar32 = GetLinearBrick((idx2 *)Idx2,
                                                      (idx2_file *)(ulong)(uint)(int)(char)Level,
                                                      (int)(&uStack_2c28)[uVar30 * 8],Brick3);
                              if (local_2e78.Capacity <= local_2e78.Size) {
                                GrowCapacity<idx2::decode_state>(&local_2e78,0);
                              }
                              lVar49 = local_2e78.Size * 0x60;
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49) = uVar36;
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 8) = local_2ee0;
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x10) = local_2d70;
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x18) = local_2d78;
                              local_2e78.Buffer.Data[lVar49 + 0x20] = uVar25;
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x21) = local_2d28;
                              *(ulong *)(local_2e78.Buffer.Data + lVar49 + 0x21 + 8) =
                                   CONCAT53(uStack_2d1d,uStack_2d20);
                              *(ulong *)(local_2e78.Buffer.Data + lVar49 + 0x2c) =
                                   CONCAT35(uStack_2d18,uStack_2d1d);
                              *(undefined8 *)(local_2e78.Buffer.Data + lVar49 + 0x2c + 8) =
                                   uStack_2d15;
                              *(ulong *)(local_2e78.Buffer.Data + lVar49 + 0x3c) =
                                   CONCAT44(uStack_2eb4,local_2eb8);
                              *(ulong *)(local_2e78.Buffer.Data + lVar49 + 0x3c + 8) =
                                   CONCAT44(uVar34,uStack_2eb0);
                              *(u64 *)(local_2e78.Buffer.Data + lVar49 + 0x50) = uVar32;
                              *(int *)(local_2e78.Buffer.Data + lVar49 + 0x58) = iVar44;
                              local_2e78.Buffer.Data[lVar49 + 0x5c] = Level;
                              uVar30 = uVar56;
                              local_2e78.Size = local_2e78.Size + 1;
                            }
                          }
                        } while (-1 < (int)uVar30);
                      }
                      else {
                        uVar9 = *(undefined8 *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 8);
                        uVar10 = *(undefined8 *)
                                  ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x10);
                        uVar11 = *(undefined8 *)
                                  ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x18);
                        uVar12 = *(undefined8 *)
                                  ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x28);
                        auStack_2c1c._4_4_ = (undefined4)uVar11;
                        iStack_2c14 = (int)((ulong)uVar11 >> 0x20);
                        lStack_2c10 = *(long *)((long)&local_1c38[0].field_1 + lVar49 + 0x20);
                        aiStack_2c08[0] = (int)uVar12;
                        aiStack_2c08[1] = (int)((ulong)uVar12 >> 0x20);
                        alStack_2c00[0] = *(long *)((long)&local_1c38[0].field_1 + lVar49 + 0x30);
                        local_2c38[0] = *ppp_Var53;
                        local_2c38[1] =
                             (_func_int **)(&local_1c38[0].field_1)[uVar30].Val.Vol.Buffer.Data;
                        uStack_2c28._0_4_ = (uint)uVar9;
                        uStack_2c28._4_4_ = (uint)((ulong)uVar9 >> 0x20);
                        uStack_2c20 = (uint)uVar10;
                        auStack_2c1c._0_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                        pp_Var8 = *ppp_Var53;
                        uVar9 = (&local_1c38[0].field_1)[uVar30].Val.Vol.Buffer.Data;
                        uStack_2ea8 = *(ulong *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 8);
                        uVar10 = *(undefined8 *)
                                  ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x10);
                        auVar3 = *(undefined1 (*) [32])
                                  ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x10);
                        aiStack_2e9c[1] = auVar3._8_4_;
                        aiStack_2e9c[2] = auVar3._12_4_;
                        lStack_2e90 = auVar3._16_8_;
                        iStack_2e88 = auVar3._24_4_;
                        uStack_2e84 = auVar3._28_4_;
                        local_2eb8 = SUB84(pp_Var8,0);
                        uStack_2ea0 = (uint)uVar10;
                        aiStack_2e9c[0] = (int)((ulong)uVar10 >> 0x20);
                        uVar50 = (ulong)(uVar34 << 2);
                        iVar44 = *(int *)((long)&local_1c38[0].field_1 + uVar50 + lVar49 + 8);
                        iVar44 = (*(int *)((long)&local_1c38[0].field_1 + uVar50 + lVar49 + 0x14) -
                                 iVar44) / 2 + iVar44;
                        *(int *)(auStack_2c1c + uVar50) = iVar44;
                        *(int *)((long)&uStack_2ea8 + uVar50) = iVar44;
                        lVar24 = lStack_2c10;
                        iVar44 = iStack_2c14;
                        uVar23 = auStack_2c1c._4_4_;
                        uVar22 = auStack_2c1c._0_4_;
                        uVar42 = uStack_2c20;
                        uVar39 = uStack_2c28._4_4_;
                        uVar34 = (uint)uStack_2c28;
                        uVar55 = auStack_2c1c._0_4_ - (uint)uStack_2c28;
                        uVar54 = auStack_2c1c._4_4_ - uStack_2c28._4_4_;
                        uVar43 = iStack_2c14 - uStack_2c20;
                        local_2e08.From =
                             (ulong)(uStack_2c20 & 0x1fffff) << 0x2a |
                             ((ulong)uStack_2c28._4_4_ & 0x1fffff) << 0x15 |
                             (ulong)(uint)uStack_2c28 & 0x1fffff;
                        local_2e08.Dims =
                             (ulong)(uVar43 & 0x1fffff) << 0x2a |
                             (ulong)(uVar54 & 0x1fffff) << 0x15 | (ulong)(uVar55 & 0x1fffff);
                        eVar60 = Crop<idx2::extent,idx2::extent>(&local_2e08,&local_2e28);
                        iVar28 = aiStack_2c08[0];
                        uVar32 = eVar60.Dims;
                        lStack_2e90 = ((long)(uVar32 << 0x16) >> 0x2b) *
                                      ((long)(uVar32 << 0x2b) >> 0x2b) *
                                      ((long)(uVar32 * 2) >> 0x2b) + lVar24;
                        eVar60 = Crop<idx2::extent,idx2::extent>(&local_2e08,&local_2d48);
                        iStack_2e88 = (((int)eVar60.Dims << 0xb) >> 0xb) *
                                      (int)((long)(eVar60.Dims * 2) >> 0x2b) *
                                      (int)((long)(eVar60.Dims << 0x16) >> 0x2b) + iVar28;
                        alStack_2c00[0] = *(long *)((long)&local_1c38[0].field_1 + lVar49 + 0x30);
                        lStack_2e80 = (long)(int)uVar43 * (long)(int)uVar54 * (long)(int)uVar55 +
                                      alStack_2c00[0];
                        iVar26 = (int)((long)(local_2e28.From << 0x2b) >> 0x2b);
                        iVar46 = (((int)local_2e28.Dims << 0xb) >> 0xb) + iVar26;
                        iVar28 = (int)((long)(local_2e28.From * 2) >> 0x2b);
                        iVar47 = (int)((long)(local_2e28.Dims * 2) >> 0x2b) + iVar28;
                        iVar40 = (int)(((long)(local_2e28.Dims << 0x16) >> 0xb) +
                                       ((long)(local_2e28.From << 0x16) >> 0xb & 0xffffffff00000000U
                                       ) >> 0x20);
                        iVar52 = (int)((long)(local_2e28.From << 0x16) >> 0x2b);
                        if (((((int)uStack_2ea8 < iVar46) && ((int)uStack_2ea8._4_4_ < iVar40)) &&
                            ((int)uStack_2ea0 < iVar47)) &&
                           (((iVar26 < aiStack_2e9c[0] && (iVar52 < aiStack_2e9c[1])) &&
                            (iVar28 < aiStack_2e9c[2])))) {
                          auVar13._4_4_ = aiStack_2e9c[2];
                          auVar13._0_4_ = aiStack_2e9c[1];
                          auVar13._8_8_ = lStack_2e90;
                          auVar13._16_4_ = iStack_2e88;
                          auVar13._20_4_ = uStack_2e84;
                          auVar13._24_8_ = lStack_2e80;
                          *(undefined1 (*) [32])
                           ((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x18) = auVar13;
                          *ppp_Var53 = pp_Var8;
                          (&local_1c38[0].field_1)[uVar30].Val.Vol.Buffer.Data = (byte *)uVar9;
                          *(ulong *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 8) = uStack_2ea8
                          ;
                          *(ulong *)((long)&local_1c38[0].field_1 + uVar30 * 0x40 + 0x10) =
                               CONCAT44(aiStack_2e9c[0],uStack_2ea0);
                          uVar29 = uVar30;
                        }
                        if ((((int)uVar34 < iVar46) && ((int)uVar39 < iVar40)) &&
                           (((int)uVar42 < iVar47 &&
                            ((iVar26 < (int)uVar22 && (iVar28 < iVar44 && iVar52 < (int)uVar23))))))
                        {
                          uVar29 = (ulong)((int)uVar29 + 1);
                          auVar17._4_4_ = iStack_2c14;
                          auVar17._0_4_ = auStack_2c1c._4_4_;
                          auVar17._8_8_ = lStack_2c10;
                          auVar17._16_4_ = aiStack_2c08[0];
                          auVar17._20_4_ = aiStack_2c08[1];
                          auVar17._24_8_ = alStack_2c00[0];
                          *(undefined1 (*) [32])
                           ((long)&local_1c38[0].field_1 + uVar29 * 0x40 + 0x18) = auVar17;
                          (&local_1c38[0]._vptr_expected)[uVar29 * 8] = local_2c38[0];
                          (&local_1c38[0].field_1)[uVar29].Val.Vol.Buffer.Data =
                               (byte *)local_2c38[1];
                          *(ulong *)((long)&local_1c38[0].field_1 + uVar29 * 0x40 + 8) =
                               CONCAT44(uStack_2c28._4_4_,(uint)uStack_2c28);
                          *(ulong *)((long)&local_1c38[0].field_1 + uVar29 * 0x40 + 0x10) =
                               CONCAT44(auStack_2c1c._0_4_,uStack_2c20);
                        }
                      }
                    }
                    uVar30 = uVar29;
                  } while (-1 < (int)uVar29);
                }
                else {
                  uVar9 = *(undefined8 *)(aiStack_c28 + uVar30 * 0xc);
                  auVar3 = *(undefined1 (*) [32])(aiStack_c28 + uVar30 * 0xc);
                  local_1c38[0].field_1.Val.Vol.Dims._0_4_ = auVar3._16_4_;
                  local_1c38[0].field_1.Val.Vol.Dims._4_4_ = auVar3._20_4_;
                  local_1c38[0].field_1.Val.Vol.Type = auVar3[0x18];
                  local_1c38[0].field_1._33_7_ = auVar3._25_7_;
                  local_1c38[0]._vptr_expected = (_func_int **)*puVar38;
                  local_1c38[0].field_1.Val.Vol.Buffer.Data =
                       (_func_int **)local_c38[uVar30 * 6 + 1];
                  local_1c38[0].field_1.Val.Vol.Buffer.Bytes._0_4_ = (undefined4)uVar9;
                  local_1c38[0].field_1.Val.Vol.Buffer.Bytes._4_4_ =
                       (undefined4)((ulong)uVar9 >> 0x20);
                  local_1c38[0].field_1._16_4_ =
                       (undefined4)*(undefined8 *)(auStack_c20 + uVar30 * 0x30);
                  local_1c38[0].field_1._20_4_ =
                       (undefined4)((ulong)*(undefined8 *)(auStack_c20 + uVar30 * 0x30) >> 0x20);
                  auStack_2c1c._4_4_ = (undefined4)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc);
                  iStack_2c14 = (int)((ulong)*(undefined8 *)(aiStack_c18 + uVar30 * 0xc) >> 0x20);
                  local_2c38[0] = (_func_int **)*puVar38;
                  local_2c38[1] = (_func_int **)local_c38[uVar30 * 6 + 1];
                  uStack_2c28._0_4_ = (uint)*(undefined8 *)(aiStack_c28 + uVar30 * 0xc);
                  uStack_2c28._4_4_ =
                       (uint)((ulong)*(undefined8 *)(aiStack_c28 + uVar30 * 0xc) >> 0x20);
                  uStack_2c20 = (uint)*(undefined8 *)(auStack_c20 + uVar30 * 0x30);
                  auStack_2c1c._0_4_ =
                       (undefined4)((ulong)*(undefined8 *)(auStack_c20 + uVar30 * 0x30) >> 0x20);
                  uVar29 = (ulong)(uVar34 << 2);
                  iVar44 = *(int *)((long)aiStack_c28 + uVar29 + lVar49);
                  iVar44 = (*(int *)(auStack_c20 + uVar29 + lVar49 + 4) - iVar44) / 2 + iVar44;
                  *(int *)((long)&local_1c38[0].field_1 + uVar29 + 0x14) = iVar44;
                  *(int *)((long)&uStack_2c28 + uVar29) = iVar44;
                  lStack_2c10 = alStack_c10[uVar30 * 6];
                  local_1c38[0].field_1.Val.Vol.Type = (undefined1)lStack_2c10;
                  local_1c38[0].field_1._33_7_ = (undefined7)((ulong)lStack_2c10 >> 8);
                  lStack_2c10 = (long)(int)(local_1c38[0].field_1.Val.Vol.Dims._4_4_ -
                                           local_1c38[0].field_1._16_4_) *
                                (long)(int)((undefined4)local_1c38[0].field_1.Val.Vol.Dims -
                                           local_1c38[0].field_1._12_4_) *
                                (long)(int)(local_1c38[0].field_1._20_4_ -
                                           local_1c38[0].field_1._8_4_) + lStack_2c10;
                  iVar46 = (int)((long)(local_2dc8.From << 0x2b) >> 0x2b);
                  iVar47 = (((int)local_2dc8.Dims << 0xb) >> 0xb) + iVar46;
                  iVar28 = (int)((long)(local_2dc8.From * 2) >> 0x2b);
                  iVar52 = (int)((long)(local_2dc8.Dims * 2) >> 0x2b) + iVar28;
                  iVar26 = (int)(((long)(local_2dc8.Dims << 0x16) >> 0xb) +
                                 ((long)(local_2dc8.From << 0x16) >> 0xb & 0xffffffff00000000U) >>
                                0x20);
                  iVar44 = (int)((long)(local_2dc8.From << 0x16) >> 0x2b);
                  if (((((int)(uint)uStack_2c28 < iVar47) && ((int)uStack_2c28._4_4_ < iVar26)) &&
                      (((int)uStack_2c20 < iVar52 &&
                       ((iVar46 < (int)auStack_2c1c._0_4_ && (iVar44 < (int)auStack_2c1c._4_4_))))))
                     && (iVar28 < iStack_2c14)) {
                    auVar3._4_4_ = uStack_2c28._4_4_;
                    auVar3._0_4_ = (uint)uStack_2c28;
                    auVar3._8_4_ = uStack_2c20;
                    auVar3._12_4_ = auStack_2c1c._0_4_;
                    auVar3._16_4_ = auStack_2c1c._4_4_;
                    auVar3._20_4_ = iStack_2c14;
                    auVar3._24_8_ = lStack_2c10;
                    *(undefined1 (*) [32])(aiStack_c28 + uVar30 * 0xc) = auVar3;
                    *puVar38 = (ulong)local_2c38[0];
                    local_c38[uVar30 * 6 + 1] = (unsigned_long)local_2c38[1];
                    *(ulong *)(aiStack_c28 + uVar30 * 0xc) =
                         CONCAT44(uStack_2c28._4_4_,(uint)uStack_2c28);
                    *(ulong *)(auStack_c20 + uVar30 * 0x30) =
                         CONCAT44(auStack_2c1c._0_4_,uStack_2c20);
                    local_2f18 = uVar30;
                  }
                  if (((((int)local_1c38[0].field_1._8_4_ < iVar47) &&
                       ((int)local_1c38[0].field_1._12_4_ < iVar26)) &&
                      ((int)local_1c38[0].field_1._16_4_ < iVar52)) &&
                     ((iVar46 < (int)local_1c38[0].field_1._20_4_ &&
                      (iVar28 < (int)local_1c38[0].field_1._28_4_ &&
                       iVar44 < (int)local_1c38[0].field_1._24_4_)))) {
                    local_2f18 = (ulong)((int)local_2f18 + 1);
                    auVar18._8_4_ = local_1c38[0].field_1._16_4_;
                    auVar18._0_8_ = uVar9;
                    auVar18._12_4_ = local_1c38[0].field_1._20_4_;
                    auVar18._16_4_ = (undefined4)local_1c38[0].field_1.Val.Vol.Dims;
                    auVar18._20_4_ = local_1c38[0].field_1.Val.Vol.Dims._4_4_;
                    auVar18[0x18] = local_1c38[0].field_1.Val.Vol.Type;
                    auVar18._25_7_ = local_1c38[0].field_1._33_7_;
                    *(undefined1 (*) [32])(aiStack_c28 + local_2f18 * 0xc) = auVar18;
                    local_c38[local_2f18 * 6] = (unsigned_long)local_1c38[0]._vptr_expected;
                    local_c38[local_2f18 * 6 + 1] = local_1c38[0].field_1.Val.Vol.Buffer.Data;
                    *(undefined8 *)(aiStack_c28 + local_2f18 * 0xc) = uVar9;
                    *(ulong *)(auStack_c20 + local_2f18 * 0x30) =
                         CONCAT44(local_1c38[0].field_1._20_4_,local_1c38[0].field_1._16_4_);
                  }
                }
              }
              uVar30 = local_2f18;
            } while (-1 < (int)local_2f18);
          }
        }
      }
    } while (0 < local_2e78.Size);
  }
  pdVar21 = local_2e38;
  local_1c38[0]._vptr_expected = (_func_int **)&local_2e38->Mutex;
  local_1c38[0].field_1.Val.Vol.Buffer.Data =
       local_1c38[0].field_1.Val.Vol.Buffer.Data & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1c38);
  local_1c38[0].field_1._0_1_ = 1;
  piVar1 = &pdVar21->NTasks;
  *piVar1 = *piVar1 + -1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1c38);
  if (pdVar21->NTasks == 0) {
    std::condition_variable::notify_all();
  }
  if ((bVar20 & 1) != 0) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x19d;
    local_2ed8 = (_func_int **)0x1bd78d;
    local_2ee0 = 0;
  }
  (*(local_2e78.Alloc)->_vptr_allocator[1])();
  eVar61.Code = (undefined1)local_2ee0;
  eVar61.StackIdx = local_2ee0._1_1_;
  eVar61.StrGened = (bool)local_2ee0._2_1_;
  eVar61._11_5_ = local_2ee0._3_5_;
  eVar61.Msg = (cstr)local_2ed8;
  return eVar61;
}

Assistant:

error<idx2_err_code>
TraverseSecondLevel(const idx2_file& Idx2,
                    const params& P,
                    decode_data* D,
                    decode_state First,
                    const extent& Extent,
                    const grid& OutGrid,
                    mmap_volume* OutVolFile,
                    volume* OutVolMem)
{
  // then decode the subtree
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  int LastIndex = 0;
  idx2_RAII(array<decode_state>, BrickStack, Reserve(&BrickStack, 128), Dealloc(&BrickStack));
  PushBack(&BrickStack, First);
  expected<brick_volume, idx2_err_code> Result;
  while (Size(BrickStack) > 0)
  {
    decode_state Current = Back(BrickStack);
    //printf("level %d current " idx2_PrStrV3i "\n", Current.Level, idx2_PrV3i(Current.Brick3));
    PopBack(&BrickStack);
    i8 NextLevel = Current.Level - 1;
    // TODO: check for error
    v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Current.Level);
    extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
    extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
    extent CurrentExtent = extent(Current.Brick3 * B3, B3);
    extent CurrentExtentCrop = Crop(CurrentExtent, P.DecodeExtent);
    //printf("  extent     " idx2_PrStrExt "\n", idx2_PrExt(CurrentExtent));
    //printf("  extent crop" idx2_PrStrExt "\n", idx2_PrExt(CurrentExtentCrop));
    if (Prod<i64>(Dims(CurrentExtentCrop)) == 0)
      continue;
    Result = DecodeTask(Idx2, P, D, Current, OutGrid, Tolerance, OutVolFile, OutVolMem);
    if (!Result)
      goto EXIT;

    if (NextLevel < 0 || Idx2.DecodeSubbandMasks[NextLevel] == 0)
      continue;

    ComputeExtentsForTraversal(Idx2,
                               CurrentExtent,
                               NextLevel,
                               &ExtentInBricks,
                               &ExtentInChunks,
                               &ExtentInFiles,
                               &VolExtentInBricks,
                               &VolExtentInChunks,
                               &VolExtentInFiles);
    idx2_FileTraverse(
      idx2_ChunkTraverse(
        idx2_BrickTraverse(
          decode_state Ds;
          Ds.BrickInChunk = Top.BrickInChunk;
          Ds.Level = NextLevel;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, NextLevel, Top.BrickFrom3);
          Ds.ParentBrick = Value(Result);
          PushBack(&BrickStack, Ds);
          ,
          64,
          Idx2.BricksOrderInChunk[NextLevel],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[NextLevel],
          Idx2.BricksPerChunk3s[NextLevel],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[NextLevel],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[NextLevel],
        Idx2.ChunksPerFile3s[NextLevel],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[NextLevel], v3i(0), Idx2.NFiles3[NextLevel], ExtentInFiles, VolExtentInFiles);


  }

  EXIT:
  {
    std::unique_lock<std::mutex> Lock(D->Mutex);
    --D->NTasks;
  }
  if (D->NTasks == 0)
    D->AllTasksDone.notify_all();

  if (!Result)
    return Error(Result);

  return idx2_Error(idx2_err_code::NoError);
}


error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}


/* TODO: dealloc chunks after we are done with them */
error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}


}